

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmessagebox.cpp
# Opt level: O0

void __thiscall QMessageBox::QMessageBox(QMessageBox *this,QWidget *parent)

{
  QFlags<Qt::WindowType> f;
  QMessageBoxPrivate *pQVar1;
  undefined8 *in_RDI;
  long in_FS_OFFSET;
  QMessageBoxPrivate *d;
  WindowType in_stack_ffffffffffffff6c;
  QWidget *in_stack_ffffffffffffff90;
  QDialogPrivate *in_stack_ffffffffffffff98;
  EVP_PKEY_CTX *ctx;
  QDialog *in_stack_ffffffffffffffa0;
  EVP_PKEY_CTX local_28 [24];
  QFlagsStorageHelper<Qt::WindowType,_4> local_10;
  QFlagsStorageHelper<Qt::WindowType,_4> local_c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = (QMessageBoxPrivate *)operator_new(0x3b0);
  QMessageBoxPrivate::QMessageBoxPrivate(pQVar1);
  local_10.super_QFlagsStorage<Qt::WindowType>.i =
       (QFlagsStorage<Qt::WindowType>)
       Qt::operator|((enum_type)((ulong)pQVar1 >> 0x20),(enum_type)pQVar1);
  local_c.super_QFlagsStorage<Qt::WindowType>.i =
       (QFlagsStorage<Qt::WindowType>)
       QFlags<Qt::WindowType>::operator|((QFlags<Qt::WindowType> *)pQVar1,in_stack_ffffffffffffff6c)
  ;
  f = QFlags<Qt::WindowType>::operator|((QFlags<Qt::WindowType> *)pQVar1,in_stack_ffffffffffffff6c);
  QDialog::QDialog(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,
                   (WindowFlags)
                   f.super_QFlagsStorageHelper<Qt::WindowType,_4>.
                   super_QFlagsStorage<Qt::WindowType>.i);
  *in_RDI = &PTR_metaObject_00d254a8;
  in_RDI[2] = &PTR__QMessageBox_00d25680;
  pQVar1 = d_func((QMessageBox *)0x7a4703);
  ctx = local_28;
  QString::QString((QString *)0x7a4721);
  QString::QString((QString *)0x7a4730);
  QMessageBoxPrivate::init(pQVar1,ctx);
  QString::~QString((QString *)0x7a474e);
  QString::~QString((QString *)0x7a4758);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QMessageBox::QMessageBox(QWidget *parent)
    : QDialog(*new QMessageBoxPrivate, parent, Qt::MSWindowsFixedSizeDialogHint | Qt::WindowTitleHint | Qt::WindowSystemMenuHint | Qt::WindowCloseButtonHint)
{
    Q_D(QMessageBox);
    d->init();
}